

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O0

void __thiscall sznet::net::Acceptor::handleRead(Acceptor *this)

{
  bool bVar1;
  int iVar2;
  sz_sock __fd;
  LogStream *this_00;
  socklen_t *__addr_len;
  sockaddr *__addr;
  SourceFile file;
  undefined1 local_1010 [12];
  Logger local_1000;
  int local_30;
  undefined1 local_2c [4];
  sz_sock connfd;
  InetAddress peerAddr;
  Acceptor *this_local;
  
  peerAddr.field_0._20_8_ = this;
  EventLoop::assertInLoopThread(this->m_loop);
  __addr_len = (socklen_t *)0x0;
  InetAddress::InetAddress((InetAddress *)local_2c,0,false,false);
  local_30 = Socket::accept(&this->m_acceptSocket,(int)local_2c,__addr,__addr_len);
  if (local_30 < 0) {
    Logger::SourceFile::SourceFile<99>
              ((SourceFile *)local_1010,
               (char (*) [99])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Acceptor.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1010._0_8_;
    file.m_size = local_1010._8_4_;
    Logger::Logger(&local_1000,file,0x50,false);
    this_00 = Logger::stream(&local_1000);
    LogStream::operator<<(this_00,"in Acceptor::handleRead");
    Logger::~Logger(&local_1000);
    iVar2 = sz_getlasterr();
    if (iVar2 == 0x18) {
      sockets::sz_closesocket(this->m_idleFd);
      __fd = Socket::fd(&this->m_acceptSocket);
      iVar2 = accept(__fd,(sockaddr *)0x0,(socklen_t *)0x0);
      this->m_idleFd = iVar2;
      sockets::sz_closesocket(this->m_idleFd);
      iVar2 = createNullFileFd();
      this->m_idleFd = iVar2;
    }
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->m_newConnectionCallback);
    if (bVar1) {
      std::function<void_(int,_const_sznet::net::InetAddress_&)>::operator()
                (&this->m_newConnectionCallback,local_30,(InetAddress *)local_2c);
    }
    else {
      sockets::sz_closesocket(local_30);
    }
  }
  return;
}

Assistant:

void Acceptor::handleRead()
{
	m_loop->assertInLoopThread();
	InetAddress peerAddr;
	// FIXME loop until no more
	sockets::sz_sock connfd = m_acceptSocket.accept(&peerAddr);
	if (connfd >= 0)
	{
		// string hostport = peerAddr.toIpPort();
		// LOG_TRACE << "Accepts of " << hostport;
		if (m_newConnectionCallback)
		{
			m_newConnectionCallback(connfd, peerAddr);
		}
		else
		{
			// û�лص��������ر�client��Ӧ��fd
			sockets::sz_closesocket(connfd);
		}
	}
	// �����׽���ʧ��
	else
	{
		LOG_SYSERR << "in Acceptor::handleRead";
		// ���صĴ�����ΪEMFILE����������������
		if (sz_getlasterr() == sz_err_emfile)
		{
			// ��ֹbusy loop
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = ::accept(m_acceptSocket.fd(), nullptr, nullptr);
			sockets::sz_closesocket(m_idleFd);
			m_idleFd = createNullFileFd();
		}
	}
}